

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportFileGenerator::GenerateImportTargetCode
          (cmExportFileGenerator *this,ostream *os,cmGeneratorTarget *target,TargetType targetType)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  string targetName;
  long *local_90;
  long local_88;
  long local_80 [2];
  string local_70;
  string local_50;
  
  pcVar2 = (this->Namespace)._M_dataplus._M_p;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + (this->Namespace)._M_string_length);
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_70,target);
  std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
  paVar1 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"# Create imported target ",0x19);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_90,local_88);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  switch(targetType) {
  case EXECUTABLE:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_executable(",0xf);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_90,local_88);
    lVar5 = 0xb;
    pcVar6 = " IMPORTED)\n";
    break;
  case STATIC_LIBRARY:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_library(",0xc);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_90,local_88);
    lVar5 = 0x12;
    pcVar6 = " STATIC IMPORTED)\n";
    break;
  case SHARED_LIBRARY:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_library(",0xc);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_90,local_88);
    lVar5 = 0x12;
    pcVar6 = " SHARED IMPORTED)\n";
    break;
  case MODULE_LIBRARY:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_library(",0xc);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_90,local_88);
    lVar5 = 0x12;
    pcVar6 = " MODULE IMPORTED)\n";
    break;
  case OBJECT_LIBRARY:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_library(",0xc);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_90,local_88);
    lVar5 = 0x12;
    pcVar6 = " OBJECT IMPORTED)\n";
    break;
  default:
    goto switchD_00389f30_caseD_5;
  case INTERFACE_LIBRARY:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_library(",0xc);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_90,local_88);
    lVar5 = 0x15;
    pcVar6 = " INTERFACE IMPORTED)\n";
    break;
  case UNKNOWN_LIBRARY:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_library(",0xc);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_90,local_88);
    lVar5 = 0x13;
    pcVar6 = " UNKNOWN IMPORTED)\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,lVar5);
switchD_00389f30_caseD_5:
  bVar3 = cmGeneratorTarget::IsExecutableWithExports(target);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_property(TARGET ",0x14);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_90,local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," PROPERTY ENABLE_EXPORTS 1)\n",0x1c);
  }
  bVar3 = cmGeneratorTarget::IsFrameworkOnApple(target);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_property(TARGET ",0x14);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_90,local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," PROPERTY FRAMEWORK 1)\n",0x17);
  }
  bVar3 = cmGeneratorTarget::IsAppBundleOnApple(target);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_property(TARGET ",0x14);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_90,local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," PROPERTY MACOSX_BUNDLE 1)\n",0x1b);
  }
  bVar3 = cmGeneratorTarget::IsCFBundleOnApple(target);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_property(TARGET ",0x14);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_90,local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," PROPERTY BUNDLE 1)\n",0x14);
  }
  bVar3 = cmGeneratorTarget::IsDeprecated(target);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_property(TARGET ",0x14);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_90,local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," PROPERTY DEPRECATION ",0x16);
    cmGeneratorTarget::GetDeprecation_abi_cxx11_(&local_50,target);
    cmExportFileGeneratorEscape(&local_70,&local_50);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"IMPORTED_NO_SYSTEM","");
  bVar3 = cmGeneratorTarget::GetPropertyAsBool(target,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_property(TARGET ",0x14);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_90,local_88);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," PROPERTY IMPORTED_NO_SYSTEM 1)\n",0x20);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"EXPORT_NO_SYSTEM","");
  bVar3 = cmGeneratorTarget::GetPropertyAsBool(target,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_property(TARGET ",0x14);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_90,local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," PROPERTY SYSTEM 0)\n",0x14);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  return;
}

Assistant:

void cmExportFileGenerator::GenerateImportTargetCode(
  std::ostream& os, cmGeneratorTarget const* target,
  cmStateEnums::TargetType targetType)
{
  // Construct the imported target name.
  std::string targetName = this->Namespace;

  targetName += target->GetExportName();

  // Create the imported target.
  os << "# Create imported target " << targetName << "\n";
  switch (targetType) {
    case cmStateEnums::EXECUTABLE:
      os << "add_executable(" << targetName << " IMPORTED)\n";
      break;
    case cmStateEnums::STATIC_LIBRARY:
      os << "add_library(" << targetName << " STATIC IMPORTED)\n";
      break;
    case cmStateEnums::SHARED_LIBRARY:
      os << "add_library(" << targetName << " SHARED IMPORTED)\n";
      break;
    case cmStateEnums::MODULE_LIBRARY:
      os << "add_library(" << targetName << " MODULE IMPORTED)\n";
      break;
    case cmStateEnums::UNKNOWN_LIBRARY:
      os << "add_library(" << targetName << " UNKNOWN IMPORTED)\n";
      break;
    case cmStateEnums::OBJECT_LIBRARY:
      os << "add_library(" << targetName << " OBJECT IMPORTED)\n";
      break;
    case cmStateEnums::INTERFACE_LIBRARY:
      os << "add_library(" << targetName << " INTERFACE IMPORTED)\n";
      break;
    default: // should never happen
      break;
  }

  // Mark the imported executable if it has exports.
  if (target->IsExecutableWithExports()) {
    os << "set_property(TARGET " << targetName
       << " PROPERTY ENABLE_EXPORTS 1)\n";
  }

  // Mark the imported library if it is a framework.
  if (target->IsFrameworkOnApple()) {
    os << "set_property(TARGET " << targetName << " PROPERTY FRAMEWORK 1)\n";
  }

  // Mark the imported executable if it is an application bundle.
  if (target->IsAppBundleOnApple()) {
    os << "set_property(TARGET " << targetName
       << " PROPERTY MACOSX_BUNDLE 1)\n";
  }

  if (target->IsCFBundleOnApple()) {
    os << "set_property(TARGET " << targetName << " PROPERTY BUNDLE 1)\n";
  }

  // generate DEPRECATION
  if (target->IsDeprecated()) {
    os << "set_property(TARGET " << targetName << " PROPERTY DEPRECATION "
       << cmExportFileGeneratorEscape(target->GetDeprecation()) << ")\n";
  }

  if (target->GetPropertyAsBool("IMPORTED_NO_SYSTEM")) {
    os << "set_property(TARGET " << targetName
       << " PROPERTY IMPORTED_NO_SYSTEM 1)\n";
  }

  if (target->GetPropertyAsBool("EXPORT_NO_SYSTEM")) {
    os << "set_property(TARGET " << targetName << " PROPERTY SYSTEM 0)\n";
  }

  os << "\n";
}